

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O0

void __thiscall Meter::setRadius(Meter *this,uint r)

{
  MeterPrivate *pMVar1;
  uint local_14;
  uint r_local;
  Meter *this_local;
  
  local_14 = r;
  if (r < 0x2d) {
    local_14 = 0x2d;
  }
  pMVar1 = QScopedPointer<MeterPrivate,_QScopedPointerDeleter<MeterPrivate>_>::operator->(&this->d);
  pMVar1->radius = local_14;
  sizeHint(this);
  QWidget::resize((QSize *)this);
  QWidget::update();
  return;
}

Assistant:

void
Meter::setRadius( uint r )
{
	if( r < 45 )
		r = 45;

	d->radius = r;

	resize( sizeHint() );

	update();
}